

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo.cpp
# Opt level: O1

void __thiscall QStorageInfo::QStorageInfo(QStorageInfo *this,QDir *dir)

{
  QStorageInfoPrivate *pQVar1;
  long in_FS_OFFSET;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QStorageInfoPrivate *)operator_new(0xa0);
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)0x0;
  (pQVar1->rootPath).d.d = (Data *)0x0;
  (pQVar1->rootPath).d.ptr = (char16_t *)0x0;
  *(undefined1 (*) [16])&(pQVar1->rootPath).d.size = (undefined1  [16])0x0;
  (pQVar1->device).d.ptr = (char *)0x0;
  (pQVar1->device).d.size = 0;
  (pQVar1->subvolume).d.d = (Data *)0x0;
  (pQVar1->subvolume).d.ptr = (char *)0x0;
  *(undefined1 (*) [16])&(pQVar1->subvolume).d.size = (undefined1  [16])0x0;
  (pQVar1->fileSystemType).d.ptr = (char *)0x0;
  (pQVar1->fileSystemType).d.size = 0;
  (pQVar1->name).d.d = (Data *)0x0;
  (pQVar1->name).d.ptr = (char16_t *)0x0;
  (pQVar1->name).d.size = 0;
  *(undefined4 *)&pQVar1->bytesTotal = 0xffffffff;
  *(undefined4 *)((long)&pQVar1->bytesTotal + 4) = 0xffffffff;
  *(undefined4 *)&pQVar1->bytesFree = 0xffffffff;
  *(undefined4 *)((long)&pQVar1->bytesFree + 4) = 0xffffffff;
  *(undefined4 *)((long)&pQVar1->bytesFree + 4) = 0xffffffff;
  *(undefined4 *)&pQVar1->bytesAvailable = 0xffffffff;
  *(undefined4 *)((long)&pQVar1->bytesAvailable + 4) = 0xffffffff;
  pQVar1->blockSize = -1;
  pQVar1->readOnly = false;
  pQVar1->ready = false;
  pQVar1->valid = false;
  (this->d).d.ptr = pQVar1;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)((int)(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
  UNLOCK();
  QDir::absolutePath(&local_30,dir);
  setPath(this,&local_30);
  if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QStorageInfo::QStorageInfo(const QDir &dir)
    : d(new QStorageInfoPrivate)
{
    setPath(dir.absolutePath());
}